

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  int iVar323;
  uint uVar324;
  ulong uVar325;
  ulong uVar326;
  long lVar327;
  ulong extraout_RAX;
  long lVar328;
  ulong uVar329;
  long lVar330;
  ulong uVar331;
  long *plVar332;
  long lVar333;
  secp256k1_fe *a_00;
  ulong uVar334;
  secp256k1_fe *r;
  long lVar335;
  secp256k1_fe *psVar336;
  ulong uVar337;
  ulong uVar338;
  ulong uVar339;
  ulong uVar340;
  ulong uVar341;
  ulong uVar342;
  ulong uVar343;
  ulong uVar344;
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  uint16_t t16 [32];
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe sStack_2b0;
  secp256k1_fe sStack_288;
  secp256k1_fe *psStack_260;
  ulong uStack_258;
  ulong uStack_250;
  secp256k1_fe *psStack_248;
  secp256k1_fe *psStack_240;
  undefined8 local_230;
  ulong local_228;
  undefined1 local_220 [16];
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  secp256k1_fe local_1e8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  secp256k1_fe *local_198;
  secp256k1_fe *local_190;
  ushort auStack_188 [16];
  uint16_t local_168 [16];
  uint16_t local_148 [16];
  ushort local_128 [16];
  ushort local_108 [16];
  ushort local_e8 [16];
  uint16_t local_c8 [32];
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  uVar331 = a->n[0];
  uVar329 = a->n[1];
  uVar5 = a->n[2];
  uVar6 = a->n[3];
  local_1f8 = a->n[4];
  if (use_sqr == 0) {
    local_228 = b->n[3];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_228;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar331;
    uVar342 = b->n[2];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar342;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar329;
    local_200 = b->n[0];
    local_208 = b->n[1];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_208;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar5;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_200;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar6;
    local_1c0 = b->n[4];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_1c0;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = local_1f8;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = SUB168(auVar32 * auVar192,0);
    auVar30 = auVar29 * auVar189 + auVar28 * auVar188 + auVar30 * auVar190 + auVar31 * auVar191 +
              auVar33 * ZEXT816(0x1000003d10);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_1c0;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar331;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_228;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar329;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar342;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar5;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_208;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar6;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_200;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = local_1f8;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = SUB168(auVar32 * auVar192,8);
    auVar28 = auVar39 * ZEXT816(0x1000003d10000) +
              auVar34 * auVar193 +
              auVar38 * auVar197 + auVar37 * auVar196 + auVar36 * auVar195 + auVar35 * auVar194 +
              (auVar30 >> 0x34);
    local_1f0 = auVar28._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_200;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar331;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_1c0;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar329;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_228;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar5;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar342;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar6;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_208;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = local_1f8;
    auVar27 = (auVar28 >> 0x34) +
              auVar44 * auVar202 + auVar43 * auVar201 + auVar42 * auVar200 + auVar41 * auVar199;
    uVar326 = auVar27._0_8_;
    uVar338 = auVar27._8_8_;
    auVar309._8_8_ = uVar338 >> 0x34;
    auVar309._0_8_ = uVar338 * 0x1000 | uVar326 >> 0x34;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar326 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar28._6_2_ & 0xf);
    auVar28 = auVar40 * auVar198 + auVar45 * ZEXT816(0x1000003d1);
    uVar326 = auVar28._0_8_;
    uVar338 = auVar28._8_8_;
    local_210 = uVar326 & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_208;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar331;
    local_220 = auVar46 * auVar203;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_200;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar329;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_1c0;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar5;
    auVar304._8_8_ = uVar338 >> 0x34;
    auVar304._0_8_ = uVar338 * 0x1000 | uVar326 >> 0x34;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_228;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar6;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar342;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = local_1f8;
    auVar309 = auVar48 * auVar205 + auVar50 * auVar207 + auVar49 * auVar206 + auVar309;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auVar309._0_8_ & 0xfffffffffffff;
    auVar304 = auVar51 * ZEXT816(0x1000003d10) + auVar47 * auVar204 + local_220 + auVar304;
    uVar326 = auVar304._0_8_;
    uVar344 = auVar309._8_8_ << 0xc | auVar309._0_8_ >> 0x34;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar342;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar331;
    auVar303 = auVar52 * auVar208;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_208;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar329;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_200;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar5;
    uVar342 = SUB168(auVar54 * auVar210,8);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_1c0;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = uVar6;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_228;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = local_1f8;
    auVar28 = auVar56 * auVar212 + auVar55 * auVar211 + (auVar309 >> 0x34);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auVar28._0_8_;
    auVar29 = auVar57 * ZEXT816(0x1000003d10) + auVar54 * auVar210 + auVar53 * auVar209 + auVar303 +
              (auVar304 >> 0x34);
    uVar341 = auVar29._8_8_ << 0xc | auVar29._0_8_ >> 0x34;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auVar28._8_8_;
    auVar27 = auVar58 * ZEXT816(0x1000003d10000);
    uVar338 = auVar30._0_8_ & 0xfffffffffffff;
    local_1e8.n[0] = local_210;
    local_1b8 = uVar5;
    local_1b0 = uVar331;
    local_1a8 = uVar6;
    local_1a0 = uVar329;
  }
  else {
    local_200 = uVar331 * 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar6;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = local_200;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar5;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar329 * 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_1f8;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = local_1f8;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(auVar9 * auVar175,0);
    auVar27 = auVar8 * auVar174 + auVar7 * auVar173 + auVar10 * ZEXT816(0x1000003d10);
    uVar325 = auVar27._0_8_;
    local_1f8 = local_1f8 * 2;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_1f8;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar331;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar6;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar329 * 2;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar5;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar5;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SUB168(auVar9 * auVar175,8);
    auVar27 = auVar14 * ZEXT816(0x1000003d10000) +
              auVar11 * auVar176 + auVar13 * auVar178 + auVar12 * auVar177 + (auVar27 >> 0x34);
    local_1f0 = auVar27._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar331;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar331;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_1f8;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar329;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar6;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = uVar5 * 2;
    auVar28 = auVar17 * auVar181 + auVar16 * auVar180 + (auVar27 >> 0x34);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (auVar28._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar27._6_2_ & 0xf);
    auVar27 = auVar18 * ZEXT816(0x1000003d1) + auVar15 * auVar179;
    local_208 = auVar27._0_8_ & 0xfffffffffffff;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar329;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_200;
    auVar303._8_8_ = uVar6;
    auVar303._0_8_ = SUB168(auVar19 * auVar182,8);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_1f8;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar5;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar6;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar6;
    auVar29 = auVar21 * auVar184 + auVar20 * auVar183 + (auVar28 >> 0x34);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auVar29._0_8_ & 0xfffffffffffff;
    auVar27 = auVar22 * ZEXT816(0x1000003d10) + auVar19 * auVar182 + (auVar27 >> 0x34);
    uVar326 = auVar27._0_8_;
    uVar342 = auVar27._8_8_ << 0xc | uVar326 >> 0x34;
    uVar344 = 0xfffffffffffff;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar5;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = local_200;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar329;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar329;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_1f8;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar6;
    auVar30 = auVar25 * auVar187 + (auVar29 >> 0x34);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auVar30._0_8_;
    auVar29 = auVar26 * ZEXT816(0x1000003d10) + auVar23 * auVar185 + auVar24 * auVar186 +
              (auVar27 >> 0x34);
    uVar341 = auVar29._8_8_ << 0xc | auVar29._0_8_ >> 0x34;
    uVar338 = uVar325 & 0xffffffffffffe;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar30._8_8_;
    auVar27 = auVar27 * ZEXT816(0x1000003d10000);
    local_228 = uVar329;
    local_1f8 = uVar325;
    local_1e8.n[0] = local_208;
  }
  local_1e8.n[2] = auVar29._0_8_ & 0xfffffffffffff;
  local_1e8.n[1] = uVar326 & 0xfffffffffffff;
  local_230 = auVar303._8_8_;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar341;
  auVar310._8_8_ = auVar29._8_8_ >> 0x34;
  auVar310._0_8_ = uVar338;
  auVar321 = auVar27 + auVar310 + auVar321;
  local_1e8.n[3] = auVar321._0_8_;
  local_1e8.n[4] = (local_1f0 & 0xffffffffffff) + (auVar321._8_8_ * 0x1000 | local_1e8.n[3] >> 0x34)
  ;
  local_1e8.n[3] = local_1e8.n[3] & 0xfffffffffffff;
  local_58.n[0] = a->n[0];
  local_58.n[1] = a->n[1];
  local_58.n[2] = a->n[2];
  local_58.n[3] = a->n[3];
  local_58.n[4] = a->n[4];
  local_88.n[0] = b->n[0];
  local_88.n[1] = b->n[1];
  local_88.n[2] = b->n[2];
  local_88.n[3] = b->n[3];
  local_88.n[4] = b->n[4];
  psStack_240 = (secp256k1_fe *)0x163aad;
  local_198 = b;
  local_190 = a;
  secp256k1_fe_impl_normalize_var(&local_1e8);
  psStack_240 = (secp256k1_fe *)0x163ab5;
  secp256k1_fe_impl_normalize_var(&local_58);
  psStack_240 = (secp256k1_fe *)0x163abd;
  secp256k1_fe_impl_normalize_var(&local_88);
  psStack_240 = (secp256k1_fe *)0x163acd;
  secp256k1_fe_impl_get_b32((uchar *)local_e8,&local_58);
  psStack_240 = (secp256k1_fe *)0x163add;
  secp256k1_fe_impl_get_b32((uchar *)local_108,&local_88);
  psStack_240 = (secp256k1_fe *)0x163aed;
  secp256k1_fe_impl_get_b32((uchar *)local_128,&local_1e8);
  lVar327 = 0x10;
  lVar328 = 0;
  do {
    uVar3 = local_108[lVar327 + -1];
    *(ushort *)((long)local_148 + lVar328) =
         local_e8[lVar327 + -1] << 8 | local_e8[lVar327 + -1] >> 8;
    uVar4 = local_128[lVar327 + -1];
    *(ushort *)((long)local_168 + lVar328) = uVar3 << 8 | uVar3 >> 8;
    *(ushort *)((long)auStack_188 + lVar328) = uVar4 << 8 | uVar4 >> 8;
    lVar328 = lVar328 + 2;
    lVar327 = lVar327 + -1;
  } while (lVar327 != 0);
  psStack_240 = (secp256k1_fe *)0x163b5d;
  mulmod256(local_c8,local_148,local_168,test_fe_mul::m16);
  lVar327 = 0;
  uVar331 = extraout_RAX;
  do {
    uVar329 = uVar331 & 0xffffffff;
    bVar1 = *(byte *)((long)local_c8 + lVar327);
    plVar332 = (long *)(ulong)bVar1;
    bVar2 = *(byte *)((long)auStack_188 + lVar327);
    a_00 = (secp256k1_fe *)(ulong)bVar2;
    uVar331 = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      uVar331 = uVar329;
    }
    iVar323 = (int)uVar331;
    if (bVar1 != bVar2) goto LAB_00163b88;
    lVar327 = lVar327 + 1;
  } while (lVar327 != 0x20);
  iVar323 = 0;
LAB_00163b88:
  if (iVar323 == 0) {
    return;
  }
  psStack_240 = (secp256k1_fe *)test_sqrt;
  test_fe_mul_cold_1();
  psVar336 = &sStack_2b0;
  r = &sStack_288;
  psStack_260 = &local_1e8;
  uStack_258 = uVar342;
  uStack_250 = uVar344;
  psStack_248 = &local_58;
  psStack_240 = &local_88;
  uVar324 = secp256k1_fe_sqrt(r,a_00);
  if (uVar324 != (plVar332 == (long *)0x0)) {
    if (plVar332 != (long *)0x0) {
      lVar328 = 0x3ffffbfffff0bc - sStack_288.n[0];
      lVar330 = 0x3ffffffffffffc - sStack_288.n[1];
      lVar333 = 0x3ffffffffffffc - sStack_288.n[2];
      lVar327 = 0x3ffffffffffffc - sStack_288.n[3];
      lVar335 = 0x3fffffffffffc - sStack_288.n[4];
      sStack_288.n[0] = sStack_288.n[0] + *plVar332;
      sStack_288.n[1] = sStack_288.n[1] + plVar332[1];
      sStack_288.n[2] = sStack_288.n[2] + plVar332[2];
      sStack_288.n[3] = sStack_288.n[3] + plVar332[3];
      sStack_288.n[4] = sStack_288.n[4] + plVar332[4];
      sStack_2b0.n[0] = lVar328 + *plVar332;
      sStack_2b0.n[1] = lVar330 + plVar332[1];
      a_00 = (secp256k1_fe *)(lVar333 + plVar332[2]);
      sStack_2b0.n[3] = lVar327 + plVar332[3];
      sStack_2b0.n[4] = lVar335 + plVar332[4];
      sStack_2b0.n[2] = (uint64_t)a_00;
      secp256k1_fe_impl_normalize(&sStack_288);
      secp256k1_fe_impl_normalize(&sStack_2b0);
      if ((((sStack_288.n[3] != 0 || sStack_288.n[1] != 0) ||
           (sStack_288.n[2] != 0 || sStack_288.n[0] != 0)) || sStack_288.n[4] != 0) &&
         (r = psVar336,
         ((sStack_2b0.n[3] != 0 || sStack_2b0.n[1] != 0) ||
         ((secp256k1_fe *)sStack_2b0.n[2] != (secp256k1_fe *)0x0 || sStack_2b0.n[0] != 0)) ||
         sStack_2b0.n[4] != 0)) goto LAB_00163cf9;
    }
    return;
  }
  test_sqrt_cold_2();
LAB_00163cf9:
  test_sqrt_cold_1();
  testutil_random_fe_non_zero_test(r + 2);
  uVar329 = r[2].n[0];
  uVar5 = r[2].n[1];
  uVar6 = r[2].n[3];
  uVar331 = uVar329 * 2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar6;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar331;
  uVar342 = r[2].n[2];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar342;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar5 * 2;
  uVar326 = r[2].n[4];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar326;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar326;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = SUB168(auVar61 * auVar215,0);
  auVar28 = auVar62 * ZEXT816(0x1000003d10) + auVar60 * auVar214 + auVar59 * auVar213;
  uVar338 = uVar326 * 2;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar338;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar329;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar6;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar5 * 2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar342;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar342;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = SUB168(auVar61 * auVar215,8);
  auVar30 = auVar66 * ZEXT816(0x1000003d10000) +
            auVar63 * auVar216 + auVar65 * auVar218 + auVar64 * auVar217 + (auVar28 >> 0x34);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar329;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar329;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar338;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar5;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar6;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar342 * 2;
  auVar27 = auVar69 * auVar221 + auVar68 * auVar220 + (auVar30 >> 0x34);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = (auVar27._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar30._6_2_ & 0xf);
  auVar29 = auVar70 * ZEXT816(0x1000003d1) + auVar67 * auVar219;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar5;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar331;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar338;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar342;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar6;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar6;
  auVar27 = auVar73 * auVar224 + auVar72 * auVar223 + (auVar27 >> 0x34);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = auVar27._0_8_ & 0xfffffffffffff;
  auVar31 = (auVar29 >> 0x34) + auVar71 * auVar222 + auVar74 * ZEXT816(0x1000003d10);
  uVar341 = auVar31._0_8_;
  uVar344 = auVar31._8_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar342;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar331;
  auVar311._8_8_ = uVar344 >> 0x34;
  auVar311._0_8_ = uVar344 * 0x1000 | uVar341 >> 0x34;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar5;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar5;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar338;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar6;
  auVar27 = auVar77 * auVar227 + (auVar27 >> 0x34);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = auVar27._0_8_;
  auVar311 = auVar78 * ZEXT816(0x1000003d10) + auVar76 * auVar226 + auVar75 * auVar225 + auVar311;
  auVar31 = auVar311 >> 0x34;
  auVar312._8_8_ = auVar31._8_8_;
  auVar312._0_8_ = auVar28._0_8_ & 0xffffffffffffe;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = auVar31._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = auVar27._8_8_;
  auVar313 = auVar79 * ZEXT816(0x1000003d10000) + auVar312 + auVar313;
  uVar339 = auVar313._0_8_;
  uVar338 = auVar29._0_8_ & 0xfffffffffffff;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar338;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar6;
  uVar340 = (auVar313._8_8_ << 0xc | uVar339 >> 0x34) + (auVar30._0_8_ & 0xffffffffffff);
  uVar341 = uVar341 & 0xfffffffffffff;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar341;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar342;
  uVar343 = auVar311._0_8_ & 0xfffffffffffff;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar343;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar5;
  uVar339 = uVar339 & 0xfffffffffffff;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar339;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar329;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar340;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar326;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = SUB168(auVar84 * auVar232,0);
  auVar28 = auVar85 * ZEXT816(0x1000003d10) +
            auVar81 * auVar229 + auVar80 * auVar228 + auVar82 * auVar230 + auVar83 * auVar231;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar338;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar326;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar341;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar6;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar343;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar342;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar339;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar5;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar340;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar329;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = SUB168(auVar84 * auVar232,8);
  auVar30 = auVar91 * ZEXT816(0x1000003d10000) +
            auVar88 * auVar235 + auVar86 * auVar233 + auVar87 * auVar234 + auVar89 * auVar236 +
            auVar90 * auVar237 + (auVar28 >> 0x34);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar338;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar329;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar341;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar326;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar343;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar6;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar339;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar342;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar340;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar5;
  auVar27 = auVar96 * auVar242 + auVar93 * auVar239 + auVar94 * auVar240 + auVar95 * auVar241 +
            (auVar30 >> 0x34);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = (auVar27._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar30._6_2_ & 0xf);
  auVar29 = auVar92 * auVar238 + auVar97 * ZEXT816(0x1000003d1);
  uVar325 = auVar29._0_8_;
  uVar331 = auVar29._8_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar338;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar5;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar341;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar329;
  auVar305._8_8_ = uVar331 >> 0x34;
  auVar305._0_8_ = uVar331 * 0x1000 | uVar325 >> 0x34;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar343;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar326;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar339;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar6;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar340;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar342;
  auVar27 = auVar102 * auVar247 + auVar101 * auVar246 + auVar100 * auVar245 + (auVar27 >> 0x34);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar27._0_8_ & 0xfffffffffffff;
  auVar305 = auVar103 * ZEXT816(0x1000003d10) + auVar98 * auVar243 + auVar99 * auVar244 + auVar305;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar338;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar342;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar341;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar5;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar343;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar329;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar339;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar326;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar340;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar6;
  auVar27 = auVar108 * auVar252 + auVar107 * auVar251 + (auVar27 >> 0x34);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = auVar27._0_8_;
  auVar29 = auVar109 * ZEXT816(0x1000003d10) +
            auVar106 * auVar250 + auVar105 * auVar249 + auVar104 * auVar248 + (auVar305 >> 0x34);
  auVar31 = auVar29 >> 0x34;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = auVar31._0_8_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = auVar27._8_8_;
  auVar314._8_8_ = auVar31._8_8_;
  auVar314._0_8_ = auVar28._0_8_ & 0xfffffffffffff;
  auVar315 = auVar110 * ZEXT816(0x1000003d10000) + auVar314 + auVar315;
  uVar344 = auVar315._0_8_;
  uVar331 = a_00->n[0];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar339;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar331;
  uVar329 = a_00->n[1];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar343;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar329;
  uVar5 = a_00->n[2];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar341;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar5;
  uVar6 = a_00->n[3];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar338;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar6;
  uVar342 = a_00->n[4];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar340;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar342;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = SUB168(auVar115 * auVar257,0);
  uVar334 = (auVar315._8_8_ << 0xc | uVar344 >> 0x34) + (auVar30._0_8_ & 0xffffffffffff);
  auVar28 = auVar116 * ZEXT816(0x1000003d10) +
            auVar112 * auVar254 + auVar114 * auVar256 + auVar113 * auVar255 + auVar111 * auVar253;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar340;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar331;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar339;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar329;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar343;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar5;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar341;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar6;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar338;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar342;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = SUB168(auVar115 * auVar257,8);
  auVar27 = auVar122 * ZEXT816(0x1000003d10000) +
            auVar118 * auVar259 + auVar119 * auVar260 + auVar121 * auVar262 + auVar120 * auVar261 +
            auVar117 * auVar258 + (auVar28 >> 0x34);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar338;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar331;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar340;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar329;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar339;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar5;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar343;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar6;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar341;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar342;
  auVar30 = (auVar27 >> 0x34) +
            auVar127 * auVar267 + auVar126 * auVar266 + auVar125 * auVar265 + auVar124 * auVar264;
  uVar326 = auVar30._0_8_;
  uVar337 = auVar30._8_8_;
  auVar316._8_8_ = uVar337 >> 0x34;
  auVar316._0_8_ = uVar337 * 0x1000 | uVar326 >> 0x34;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar326 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar27._6_2_ & 0xf);
  auVar30 = auVar128 * ZEXT816(0x1000003d1) + auVar123 * auVar263;
  uVar326 = auVar30._0_8_;
  uVar337 = auVar30._8_8_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar341;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar331;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar338;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar329;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar340;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar5;
  auVar306._8_8_ = uVar337 >> 0x34;
  auVar306._0_8_ = uVar337 * 0x1000 | uVar326 >> 0x34;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar339;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar6;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar343;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar342;
  auVar316 = auVar131 * auVar270 + auVar133 * auVar272 + auVar132 * auVar271 + auVar316;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = auVar316._0_8_ & 0xfffffffffffff;
  auVar306 = auVar134 * ZEXT816(0x1000003d10) + auVar130 * auVar269 + auVar129 * auVar268 + auVar306
  ;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar343;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar331;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar341;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar329;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar338;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar5;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar340;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar6;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar339;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar342;
  auVar30 = auVar139 * auVar277 + auVar138 * auVar276 + (auVar316 >> 0x34);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = auVar30._0_8_;
  auVar31 = auVar140 * ZEXT816(0x1000003d10) +
            auVar135 * auVar273 + auVar137 * auVar275 + auVar136 * auVar274 + (auVar306 >> 0x34);
  r->n[0] = uVar326 & 0xfffffffffffff;
  auVar32 = auVar31 >> 0x34;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = auVar32._0_8_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = auVar30._8_8_;
  auVar317._8_8_ = auVar32._8_8_;
  auVar317._0_8_ = auVar28._0_8_ & 0xfffffffffffff;
  r->n[1] = auVar306._0_8_ & 0xfffffffffffff;
  auVar318 = auVar141 * ZEXT816(0x1000003d10000) + auVar317 + auVar318;
  uVar331 = auVar318._0_8_;
  r->n[2] = auVar31._0_8_ & 0xfffffffffffff;
  r->n[3] = uVar331 & 0xfffffffffffff;
  r->n[4] = (auVar318._8_8_ << 0xc | uVar331 >> 0x34) + (auVar27._0_8_ & 0xffffffffffff);
  uVar331 = a_00[1].n[0];
  uVar344 = uVar344 & 0xfffffffffffff;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar344;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar331;
  uVar326 = auVar29._0_8_ & 0xfffffffffffff;
  uVar329 = a_00[1].n[1];
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar326;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar329;
  uVar337 = auVar305._0_8_ & 0xfffffffffffff;
  uVar5 = a_00[1].n[2];
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar337;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar5;
  uVar325 = uVar325 & 0xfffffffffffff;
  uVar6 = a_00[1].n[3];
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar325;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar6;
  uVar342 = a_00[1].n[4];
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar334;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar342;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = SUB168(auVar146 * auVar282,0);
  auVar28 = auVar147 * ZEXT816(0x1000003d10) +
            auVar142 * auVar278 + auVar143 * auVar279 + auVar145 * auVar281 + auVar144 * auVar280;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar334;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar331;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar344;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar329;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar326;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar5;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar337;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar6;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar325;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar342;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = SUB168(auVar146 * auVar282,8);
  auVar27 = auVar153 * ZEXT816(0x1000003d10000) +
            auVar148 * auVar283 +
            auVar149 * auVar284 + auVar150 * auVar285 + auVar152 * auVar287 + auVar151 * auVar286 +
            (auVar28 >> 0x34);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar325;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar331;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar334;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar329;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar344;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar5;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar326;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar6;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar337;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar342;
  auVar29 = (auVar27 >> 0x34) +
            auVar156 * auVar290 + auVar158 * auVar292 + auVar157 * auVar291 + auVar155 * auVar289;
  uVar338 = auVar29._0_8_;
  uVar341 = auVar29._8_8_;
  auVar322._8_8_ = uVar341 >> 0x34;
  auVar322._0_8_ = uVar341 * 0x1000 | uVar338 >> 0x34;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar338 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar27._6_2_ & 0xf);
  auVar29 = auVar154 * auVar288 + auVar159 * ZEXT816(0x1000003d1);
  uVar338 = auVar29._0_8_;
  uVar341 = auVar29._8_8_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar337;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar331;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar325;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar329;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar334;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar5;
  auVar307._8_8_ = uVar341 >> 0x34;
  auVar307._0_8_ = uVar341 * 0x1000 | uVar338 >> 0x34;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar344;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar6;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar326;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar342;
  auVar322 = auVar162 * auVar295 + auVar164 * auVar297 + auVar163 * auVar296 + auVar322;
  uVar339 = auVar322._0_8_;
  uVar341 = auVar322._8_8_;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar339 & 0xfffffffffffff;
  auVar307 = auVar165 * ZEXT816(0x1000003d10) + auVar160 * auVar293 + auVar161 * auVar294 + auVar307
  ;
  auVar308._8_8_ = uVar341 >> 0x34;
  auVar308._0_8_ = uVar341 * 0x1000 | uVar339 >> 0x34;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar326;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar331;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar337;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar329;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar325;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar5;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar334;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar6;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar344;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar342;
  auVar308 = auVar170 * auVar302 + auVar169 * auVar301 + auVar308;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = auVar308._0_8_;
  r[1].n[0] = uVar338 & 0xfffffffffffff;
  auVar29 = auVar171 * ZEXT816(0x1000003d10) +
            auVar166 * auVar298 + auVar168 * auVar300 + auVar167 * auVar299 + (auVar307 >> 0x34);
  r[1].n[1] = auVar307._0_8_ & 0xfffffffffffff;
  auVar30 = auVar29 >> 0x34;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = auVar30._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = auVar308._8_8_;
  auVar319._8_8_ = auVar30._8_8_;
  auVar319._0_8_ = auVar28._0_8_ & 0xfffffffffffff;
  r[1].n[2] = auVar29._0_8_ & 0xfffffffffffff;
  auVar320 = auVar172 * ZEXT816(0x1000003d10000) + auVar319 + auVar320;
  uVar331 = auVar320._0_8_;
  r[1].n[3] = uVar331 & 0xfffffffffffff;
  r[1].n[4] = (auVar320._8_8_ << 0xc | uVar331 >> 0x34) + (auVar27._0_8_ & 0xffffffffffff);
  *(int *)r[3].n = (int)a_00[2].n[0];
  return;
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}